

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall toml::serialization_error::~serialization_error(serialization_error *this)

{
  ~serialization_error(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

~serialization_error() noexcept override = default;